

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t
zeGetCommandListProcAddrTable(ze_api_version_t version,ze_command_list_dditable_t *pDdiTable)

{
  ze_pfnCommandListCreateImmediate_t p_Var1;
  ze_pfnCommandListClose_t p_Var2;
  ze_pfnCommandListAppendWriteGlobalTimestamp_t p_Var3;
  ze_pfnCommandListAppendMemoryRangesBarrier_t p_Var4;
  ze_pfnCommandListAppendMemoryFill_t p_Var5;
  ze_pfnCommandListAppendMemoryCopyFromContext_t p_Var6;
  ze_pfnCommandListAppendImageCopyRegion_t p_Var7;
  ze_pfnCommandListAppendImageCopyFromMemory_t p_Var8;
  ze_pfnCommandListAppendMemAdvise_t p_Var9;
  ze_pfnCommandListAppendWaitOnEvents_t p_Var10;
  ze_pfnCommandListAppendQueryKernelTimestamps_t p_Var11;
  ze_pfnCommandListAppendLaunchCooperativeKernel_t p_Var12;
  ze_pfnCommandListAppendLaunchMultipleKernelsIndirect_t p_Var13;
  ze_pfnCommandListAppendWaitExternalSemaphoreExt_t p_Var14;
  ze_pfnCommandListAppendImageCopyFromMemoryExt_t p_Var15;
  ze_pfnCommandListGetDeviceHandle_t p_Var16;
  ze_pfnCommandListGetOrdinal_t p_Var17;
  ze_pfnCommandListIsImmediate_t p_Var18;
  ze_api_version_t *pzVar19;
  ze_result_t zVar20;
  
  pzVar19 = validation_layer::context;
  if (pDdiTable == (ze_command_list_dditable_t *)0x0) {
    zVar20 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar20 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      p_Var1 = pDdiTable->pfnCreateImmediate;
      *(ze_pfnCommandListCreate_t *)(validation_layer::context + 0x86) = pDdiTable->pfnCreate;
      *(ze_pfnCommandListCreateImmediate_t *)(pzVar19 + 0x88) = p_Var1;
      pDdiTable->pfnCreate = validation_layer::zeCommandListCreate;
      pDdiTable->pfnCreateImmediate = validation_layer::zeCommandListCreateImmediate;
      p_Var2 = pDdiTable->pfnClose;
      *(ze_pfnCommandListDestroy_t *)(pzVar19 + 0x8a) = pDdiTable->pfnDestroy;
      *(ze_pfnCommandListClose_t *)(pzVar19 + 0x8c) = p_Var2;
      pDdiTable->pfnDestroy = validation_layer::zeCommandListDestroy;
      pDdiTable->pfnClose = validation_layer::zeCommandListClose;
      p_Var3 = pDdiTable->pfnAppendWriteGlobalTimestamp;
      *(ze_pfnCommandListReset_t *)(pzVar19 + 0x8e) = pDdiTable->pfnReset;
      *(ze_pfnCommandListAppendWriteGlobalTimestamp_t *)(pzVar19 + 0x90) = p_Var3;
      pDdiTable->pfnReset = validation_layer::zeCommandListReset;
      pDdiTable->pfnAppendWriteGlobalTimestamp =
           validation_layer::zeCommandListAppendWriteGlobalTimestamp;
      p_Var4 = pDdiTable->pfnAppendMemoryRangesBarrier;
      *(ze_pfnCommandListAppendBarrier_t *)(pzVar19 + 0x92) = pDdiTable->pfnAppendBarrier;
      *(ze_pfnCommandListAppendMemoryRangesBarrier_t *)(pzVar19 + 0x94) = p_Var4;
      pDdiTable->pfnAppendBarrier = validation_layer::zeCommandListAppendBarrier;
      pDdiTable->pfnAppendMemoryRangesBarrier =
           validation_layer::zeCommandListAppendMemoryRangesBarrier;
      p_Var5 = pDdiTable->pfnAppendMemoryFill;
      *(ze_pfnCommandListAppendMemoryCopy_t *)(pzVar19 + 0x96) = pDdiTable->pfnAppendMemoryCopy;
      *(ze_pfnCommandListAppendMemoryFill_t *)(pzVar19 + 0x98) = p_Var5;
      pDdiTable->pfnAppendMemoryCopy = validation_layer::zeCommandListAppendMemoryCopy;
      pDdiTable->pfnAppendMemoryFill = validation_layer::zeCommandListAppendMemoryFill;
      p_Var6 = pDdiTable->pfnAppendMemoryCopyFromContext;
      *(ze_pfnCommandListAppendMemoryCopyRegion_t *)(pzVar19 + 0x9a) =
           pDdiTable->pfnAppendMemoryCopyRegion;
      *(ze_pfnCommandListAppendMemoryCopyFromContext_t *)(pzVar19 + 0x9c) = p_Var6;
      pDdiTable->pfnAppendMemoryCopyRegion = validation_layer::zeCommandListAppendMemoryCopyRegion;
      pDdiTable->pfnAppendMemoryCopyFromContext =
           validation_layer::zeCommandListAppendMemoryCopyFromContext;
      p_Var7 = pDdiTable->pfnAppendImageCopyRegion;
      *(ze_pfnCommandListAppendImageCopy_t *)(pzVar19 + 0x9e) = pDdiTable->pfnAppendImageCopy;
      *(ze_pfnCommandListAppendImageCopyRegion_t *)(pzVar19 + 0xa0) = p_Var7;
      pDdiTable->pfnAppendImageCopy = validation_layer::zeCommandListAppendImageCopy;
      pDdiTable->pfnAppendImageCopyRegion = validation_layer::zeCommandListAppendImageCopyRegion;
      p_Var8 = pDdiTable->pfnAppendImageCopyFromMemory;
      *(ze_pfnCommandListAppendImageCopyToMemory_t *)(pzVar19 + 0xa2) =
           pDdiTable->pfnAppendImageCopyToMemory;
      *(ze_pfnCommandListAppendImageCopyFromMemory_t *)(pzVar19 + 0xa4) = p_Var8;
      pDdiTable->pfnAppendImageCopyToMemory = validation_layer::zeCommandListAppendImageCopyToMemory
      ;
      pDdiTable->pfnAppendImageCopyFromMemory =
           validation_layer::zeCommandListAppendImageCopyFromMemory;
      p_Var9 = pDdiTable->pfnAppendMemAdvise;
      *(ze_pfnCommandListAppendMemoryPrefetch_t *)(pzVar19 + 0xa6) =
           pDdiTable->pfnAppendMemoryPrefetch;
      *(ze_pfnCommandListAppendMemAdvise_t *)(pzVar19 + 0xa8) = p_Var9;
      pDdiTable->pfnAppendMemoryPrefetch = validation_layer::zeCommandListAppendMemoryPrefetch;
      pDdiTable->pfnAppendMemAdvise = validation_layer::zeCommandListAppendMemAdvise;
      p_Var10 = pDdiTable->pfnAppendWaitOnEvents;
      *(ze_pfnCommandListAppendSignalEvent_t *)(pzVar19 + 0xaa) = pDdiTable->pfnAppendSignalEvent;
      *(ze_pfnCommandListAppendWaitOnEvents_t *)(pzVar19 + 0xac) = p_Var10;
      pDdiTable->pfnAppendSignalEvent = validation_layer::zeCommandListAppendSignalEvent;
      pDdiTable->pfnAppendWaitOnEvents = validation_layer::zeCommandListAppendWaitOnEvents;
      p_Var11 = pDdiTable->pfnAppendQueryKernelTimestamps;
      *(ze_pfnCommandListAppendEventReset_t *)(pzVar19 + 0xae) = pDdiTable->pfnAppendEventReset;
      *(ze_pfnCommandListAppendQueryKernelTimestamps_t *)(pzVar19 + 0xb0) = p_Var11;
      pDdiTable->pfnAppendEventReset = validation_layer::zeCommandListAppendEventReset;
      pDdiTable->pfnAppendQueryKernelTimestamps =
           validation_layer::zeCommandListAppendQueryKernelTimestamps;
      p_Var12 = pDdiTable->pfnAppendLaunchCooperativeKernel;
      *(ze_pfnCommandListAppendLaunchKernel_t *)(pzVar19 + 0xb2) = pDdiTable->pfnAppendLaunchKernel;
      *(ze_pfnCommandListAppendLaunchCooperativeKernel_t *)(pzVar19 + 0xb4) = p_Var12;
      pDdiTable->pfnAppendLaunchKernel = validation_layer::zeCommandListAppendLaunchKernel;
      pDdiTable->pfnAppendLaunchCooperativeKernel =
           validation_layer::zeCommandListAppendLaunchCooperativeKernel;
      p_Var13 = pDdiTable->pfnAppendLaunchMultipleKernelsIndirect;
      *(ze_pfnCommandListAppendLaunchKernelIndirect_t *)(pzVar19 + 0xb6) =
           pDdiTable->pfnAppendLaunchKernelIndirect;
      *(ze_pfnCommandListAppendLaunchMultipleKernelsIndirect_t *)(pzVar19 + 0xb8) = p_Var13;
      pDdiTable->pfnAppendLaunchKernelIndirect =
           validation_layer::zeCommandListAppendLaunchKernelIndirect;
      pDdiTable->pfnAppendLaunchMultipleKernelsIndirect =
           validation_layer::zeCommandListAppendLaunchMultipleKernelsIndirect;
      p_Var14 = pDdiTable->pfnAppendWaitExternalSemaphoreExt;
      *(ze_pfnCommandListAppendSignalExternalSemaphoreExt_t *)(pzVar19 + 0xca) =
           pDdiTable->pfnAppendSignalExternalSemaphoreExt;
      *(ze_pfnCommandListAppendWaitExternalSemaphoreExt_t *)(pzVar19 + 0xcc) = p_Var14;
      pDdiTable->pfnAppendSignalExternalSemaphoreExt =
           validation_layer::zeCommandListAppendSignalExternalSemaphoreExt;
      pDdiTable->pfnAppendWaitExternalSemaphoreExt =
           validation_layer::zeCommandListAppendWaitExternalSemaphoreExt;
      p_Var15 = pDdiTable->pfnAppendImageCopyFromMemoryExt;
      *(ze_pfnCommandListAppendImageCopyToMemoryExt_t *)(pzVar19 + 0xba) =
           pDdiTable->pfnAppendImageCopyToMemoryExt;
      *(ze_pfnCommandListAppendImageCopyFromMemoryExt_t *)(pzVar19 + 0xbc) = p_Var15;
      pDdiTable->pfnAppendImageCopyToMemoryExt =
           validation_layer::zeCommandListAppendImageCopyToMemoryExt;
      pDdiTable->pfnAppendImageCopyFromMemoryExt =
           validation_layer::zeCommandListAppendImageCopyFromMemoryExt;
      p_Var16 = pDdiTable->pfnGetDeviceHandle;
      *(ze_pfnCommandListHostSynchronize_t *)(pzVar19 + 0xbe) = pDdiTable->pfnHostSynchronize;
      *(ze_pfnCommandListGetDeviceHandle_t *)(pzVar19 + 0xc0) = p_Var16;
      pDdiTable->pfnHostSynchronize = validation_layer::zeCommandListHostSynchronize;
      pDdiTable->pfnGetDeviceHandle = validation_layer::zeCommandListGetDeviceHandle;
      p_Var17 = pDdiTable->pfnGetOrdinal;
      *(ze_pfnCommandListGetContextHandle_t *)(pzVar19 + 0xc2) = pDdiTable->pfnGetContextHandle;
      *(ze_pfnCommandListGetOrdinal_t *)(pzVar19 + 0xc4) = p_Var17;
      pDdiTable->pfnGetContextHandle = validation_layer::zeCommandListGetContextHandle;
      pDdiTable->pfnGetOrdinal = validation_layer::zeCommandListGetOrdinal;
      p_Var18 = pDdiTable->pfnIsImmediate;
      *(ze_pfnCommandListImmediateGetIndex_t *)(pzVar19 + 0xc6) = pDdiTable->pfnImmediateGetIndex;
      *(ze_pfnCommandListIsImmediate_t *)(pzVar19 + 200) = p_Var18;
      pDdiTable->pfnImmediateGetIndex = validation_layer::zeCommandListImmediateGetIndex;
      pDdiTable->pfnIsImmediate = validation_layer::zeCommandListIsImmediate;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar20;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetCommandListProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_command_list_dditable_t* pDdiTable           ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.CommandList;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = validation_layer::zeCommandListCreate;

    dditable.pfnCreateImmediate                          = pDdiTable->pfnCreateImmediate;
    pDdiTable->pfnCreateImmediate                        = validation_layer::zeCommandListCreateImmediate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = validation_layer::zeCommandListDestroy;

    dditable.pfnClose                                    = pDdiTable->pfnClose;
    pDdiTable->pfnClose                                  = validation_layer::zeCommandListClose;

    dditable.pfnReset                                    = pDdiTable->pfnReset;
    pDdiTable->pfnReset                                  = validation_layer::zeCommandListReset;

    dditable.pfnAppendWriteGlobalTimestamp               = pDdiTable->pfnAppendWriteGlobalTimestamp;
    pDdiTable->pfnAppendWriteGlobalTimestamp             = validation_layer::zeCommandListAppendWriteGlobalTimestamp;

    dditable.pfnAppendBarrier                            = pDdiTable->pfnAppendBarrier;
    pDdiTable->pfnAppendBarrier                          = validation_layer::zeCommandListAppendBarrier;

    dditable.pfnAppendMemoryRangesBarrier                = pDdiTable->pfnAppendMemoryRangesBarrier;
    pDdiTable->pfnAppendMemoryRangesBarrier              = validation_layer::zeCommandListAppendMemoryRangesBarrier;

    dditable.pfnAppendMemoryCopy                         = pDdiTable->pfnAppendMemoryCopy;
    pDdiTable->pfnAppendMemoryCopy                       = validation_layer::zeCommandListAppendMemoryCopy;

    dditable.pfnAppendMemoryFill                         = pDdiTable->pfnAppendMemoryFill;
    pDdiTable->pfnAppendMemoryFill                       = validation_layer::zeCommandListAppendMemoryFill;

    dditable.pfnAppendMemoryCopyRegion                   = pDdiTable->pfnAppendMemoryCopyRegion;
    pDdiTable->pfnAppendMemoryCopyRegion                 = validation_layer::zeCommandListAppendMemoryCopyRegion;

    dditable.pfnAppendMemoryCopyFromContext              = pDdiTable->pfnAppendMemoryCopyFromContext;
    pDdiTable->pfnAppendMemoryCopyFromContext            = validation_layer::zeCommandListAppendMemoryCopyFromContext;

    dditable.pfnAppendImageCopy                          = pDdiTable->pfnAppendImageCopy;
    pDdiTable->pfnAppendImageCopy                        = validation_layer::zeCommandListAppendImageCopy;

    dditable.pfnAppendImageCopyRegion                    = pDdiTable->pfnAppendImageCopyRegion;
    pDdiTable->pfnAppendImageCopyRegion                  = validation_layer::zeCommandListAppendImageCopyRegion;

    dditable.pfnAppendImageCopyToMemory                  = pDdiTable->pfnAppendImageCopyToMemory;
    pDdiTable->pfnAppendImageCopyToMemory                = validation_layer::zeCommandListAppendImageCopyToMemory;

    dditable.pfnAppendImageCopyFromMemory                = pDdiTable->pfnAppendImageCopyFromMemory;
    pDdiTable->pfnAppendImageCopyFromMemory              = validation_layer::zeCommandListAppendImageCopyFromMemory;

    dditable.pfnAppendMemoryPrefetch                     = pDdiTable->pfnAppendMemoryPrefetch;
    pDdiTable->pfnAppendMemoryPrefetch                   = validation_layer::zeCommandListAppendMemoryPrefetch;

    dditable.pfnAppendMemAdvise                          = pDdiTable->pfnAppendMemAdvise;
    pDdiTable->pfnAppendMemAdvise                        = validation_layer::zeCommandListAppendMemAdvise;

    dditable.pfnAppendSignalEvent                        = pDdiTable->pfnAppendSignalEvent;
    pDdiTable->pfnAppendSignalEvent                      = validation_layer::zeCommandListAppendSignalEvent;

    dditable.pfnAppendWaitOnEvents                       = pDdiTable->pfnAppendWaitOnEvents;
    pDdiTable->pfnAppendWaitOnEvents                     = validation_layer::zeCommandListAppendWaitOnEvents;

    dditable.pfnAppendEventReset                         = pDdiTable->pfnAppendEventReset;
    pDdiTable->pfnAppendEventReset                       = validation_layer::zeCommandListAppendEventReset;

    dditable.pfnAppendQueryKernelTimestamps              = pDdiTable->pfnAppendQueryKernelTimestamps;
    pDdiTable->pfnAppendQueryKernelTimestamps            = validation_layer::zeCommandListAppendQueryKernelTimestamps;

    dditable.pfnAppendLaunchKernel                       = pDdiTable->pfnAppendLaunchKernel;
    pDdiTable->pfnAppendLaunchKernel                     = validation_layer::zeCommandListAppendLaunchKernel;

    dditable.pfnAppendLaunchCooperativeKernel            = pDdiTable->pfnAppendLaunchCooperativeKernel;
    pDdiTable->pfnAppendLaunchCooperativeKernel          = validation_layer::zeCommandListAppendLaunchCooperativeKernel;

    dditable.pfnAppendLaunchKernelIndirect               = pDdiTable->pfnAppendLaunchKernelIndirect;
    pDdiTable->pfnAppendLaunchKernelIndirect             = validation_layer::zeCommandListAppendLaunchKernelIndirect;

    dditable.pfnAppendLaunchMultipleKernelsIndirect      = pDdiTable->pfnAppendLaunchMultipleKernelsIndirect;
    pDdiTable->pfnAppendLaunchMultipleKernelsIndirect    = validation_layer::zeCommandListAppendLaunchMultipleKernelsIndirect;

    dditable.pfnAppendSignalExternalSemaphoreExt         = pDdiTable->pfnAppendSignalExternalSemaphoreExt;
    pDdiTable->pfnAppendSignalExternalSemaphoreExt       = validation_layer::zeCommandListAppendSignalExternalSemaphoreExt;

    dditable.pfnAppendWaitExternalSemaphoreExt           = pDdiTable->pfnAppendWaitExternalSemaphoreExt;
    pDdiTable->pfnAppendWaitExternalSemaphoreExt         = validation_layer::zeCommandListAppendWaitExternalSemaphoreExt;

    dditable.pfnAppendImageCopyToMemoryExt               = pDdiTable->pfnAppendImageCopyToMemoryExt;
    pDdiTable->pfnAppendImageCopyToMemoryExt             = validation_layer::zeCommandListAppendImageCopyToMemoryExt;

    dditable.pfnAppendImageCopyFromMemoryExt             = pDdiTable->pfnAppendImageCopyFromMemoryExt;
    pDdiTable->pfnAppendImageCopyFromMemoryExt           = validation_layer::zeCommandListAppendImageCopyFromMemoryExt;

    dditable.pfnHostSynchronize                          = pDdiTable->pfnHostSynchronize;
    pDdiTable->pfnHostSynchronize                        = validation_layer::zeCommandListHostSynchronize;

    dditable.pfnGetDeviceHandle                          = pDdiTable->pfnGetDeviceHandle;
    pDdiTable->pfnGetDeviceHandle                        = validation_layer::zeCommandListGetDeviceHandle;

    dditable.pfnGetContextHandle                         = pDdiTable->pfnGetContextHandle;
    pDdiTable->pfnGetContextHandle                       = validation_layer::zeCommandListGetContextHandle;

    dditable.pfnGetOrdinal                               = pDdiTable->pfnGetOrdinal;
    pDdiTable->pfnGetOrdinal                             = validation_layer::zeCommandListGetOrdinal;

    dditable.pfnImmediateGetIndex                        = pDdiTable->pfnImmediateGetIndex;
    pDdiTable->pfnImmediateGetIndex                      = validation_layer::zeCommandListImmediateGetIndex;

    dditable.pfnIsImmediate                              = pDdiTable->pfnIsImmediate;
    pDdiTable->pfnIsImmediate                            = validation_layer::zeCommandListIsImmediate;

    return result;
}